

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,XML_Bool isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  XML_Char XVar1;
  DTD *table;
  char *ptr_00;
  XML_Bool XVar2;
  int iVar3;
  uint uVar4;
  XML_Error XVar5;
  char *pcVar6;
  XML_Char *pXVar7;
  NAMED *pNVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  ulong uVar10;
  char *next;
  uint local_5c;
  uint local_58;
  XML_Char buf [4];
  
  uVar9 = CONCAT71(in_register_00000011,isCdata) & 0xffffffff;
  table = parser->m_dtd;
  local_58 = (uint)isCdata;
LAB_003893e5:
  pcVar6 = ptr;
  iVar3 = (*enc->literalScanners[0])(enc,pcVar6,end,&next);
  switch(iVar3) {
  case 0:
    if (parser->m_encoding == enc) {
      parser->m_eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    }
    return XML_ERROR_INVALID_TOKEN;
  case 6:
    pXVar7 = poolAppend(pool,enc,pcVar6,next);
    ptr = next;
    if (pXVar7 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    goto LAB_003893e5;
  case 7:
    break;
  case 9:
    iVar3 = (*enc->predefinedEntityName)
                      (enc,pcVar6 + enc->minBytesPerChar,next + -(long)enc->minBytesPerChar);
    if ((char)iVar3 == '\0') {
      pXVar7 = poolStoreString(&parser->m_temp2Pool,enc,pcVar6 + enc->minBytesPerChar,
                               next + -(long)enc->minBytesPerChar);
      if (pXVar7 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      local_5c = (uint)uVar9;
      pNVar8 = lookup(parser,&table->generalEntities,pXVar7,0);
      (parser->m_temp2Pool).ptr = (parser->m_temp2Pool).start;
      if (&table->pool == pool) {
        if (table->standalone == '\0') {
          if (table->hasParamEntityRefs == '\0') goto LAB_003895f1;
          goto LAB_00389627;
        }
        if (parser->m_openInternalEntities != (OPEN_INTERNAL_ENTITY *)0x0) goto LAB_00389627;
LAB_003895f1:
        if (pNVar8 == (NAMED *)0x0) {
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (*(char *)((long)&pNVar8[7].name + 2) == '\0') {
          return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
      }
      else {
        if ((table->hasParamEntityRefs == '\0') || (table->standalone != '\0')) goto LAB_003895f1;
LAB_00389627:
        uVar9 = (ulong)local_5c;
        ptr = next;
        if (pNVar8 == (NAMED *)0x0) goto LAB_003893e5;
      }
      uVar9 = (ulong)local_5c;
      if (*(char *)&pNVar8[7].name != '\0') {
        XVar5 = XML_ERROR_RECURSIVE_ENTITY_REF;
        goto LAB_003896f2;
      }
      if (pNVar8[6].name != (KEY)0x0) {
        XVar5 = XML_ERROR_BINARY_ENTITY_REF;
        goto LAB_003896f2;
      }
      ptr_00 = pNVar8[1].name;
      if (ptr_00 == (char *)0x0) {
        XVar5 = XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        goto LAB_003896f2;
      }
      *(undefined1 *)&pNVar8[7].name = 1;
      XVar5 = appendAttributeValue
                        (parser,parser->m_internalEncoding,(XML_Bool)local_58,ptr_00,
                         ptr_00 + *(int *)&pNVar8[2].name,pool);
      *(undefined1 *)&pNVar8[7].name = 0;
      ptr = next;
      if (XVar5 != XML_ERROR_NONE) {
        return XVar5;
      }
    }
    else {
      pcVar6 = pool->ptr;
      if (pcVar6 == pool->end) {
        XVar2 = poolGrow(pool);
        if (XVar2 == '\0') {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar6 = pool->ptr;
      }
      pool->ptr = pcVar6 + 1;
      *pcVar6 = (char)iVar3;
      ptr = next;
    }
    goto LAB_003893e5;
  case 10:
    iVar3 = (*enc->charRefNumber)(enc,pcVar6);
    if (iVar3 < 0) {
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = pcVar6;
        return XML_ERROR_BAD_CHAR_REF;
      }
      return XML_ERROR_BAD_CHAR_REF;
    }
    if ((iVar3 != 0x20 || (char)uVar9 != '\0') ||
       ((ptr = next, pool->ptr != pool->start && (ptr = next, pool->ptr[-1] != ' ')))) {
      uVar4 = XmlUtf8Encode(iVar3,buf);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      for (uVar10 = 0; ptr = next, uVar4 != uVar10; uVar10 = uVar10 + 1) {
        pXVar7 = pool->ptr;
        if (pXVar7 == pool->end) {
          XVar2 = poolGrow(pool);
          if (XVar2 == '\0') {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar7 = pool->ptr;
        }
        XVar1 = buf[uVar10];
        pool->ptr = pXVar7 + 1;
        *pXVar7 = XVar1;
      }
    }
    goto LAB_003893e5;
  case -4:
    return XML_ERROR_NONE;
  case -3:
    next = pcVar6 + enc->minBytesPerChar;
    break;
  case -2:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 8:
switchD_0038940d_caseD_fffffffe:
    XVar5 = XML_ERROR_UNEXPECTED_STATE;
LAB_003896f2:
    if (parser->m_encoding == enc) {
      parser->m_eventPtr = pcVar6;
      return XVar5;
    }
    return XVar5;
  case -1:
    XVar5 = XML_ERROR_INVALID_TOKEN;
    goto LAB_003896f2;
  default:
    if (iVar3 != 0x27) goto switchD_0038940d_caseD_fffffffe;
  }
  pXVar7 = pool->ptr;
  if (((char)uVar9 != '\0') ||
     ((ptr = next, pXVar7 != pool->start && (ptr = next, pXVar7[-1] != ' ')))) {
    if (pXVar7 == pool->end) {
      XVar2 = poolGrow(pool);
      if (XVar2 == '\0') {
        return XML_ERROR_NO_MEMORY;
      }
      pXVar7 = pool->ptr;
    }
    pool->ptr = pXVar7 + 1;
    *pXVar7 = ' ';
    ptr = next;
  }
  goto LAB_003893e5;
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, XML_Bool isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        /* The XmlEncode() functions can never return 0 here.  That
         * error return happens if the code point passed in is either
         * negative or greater than or equal to 0x110000.  The
         * XmlCharRefNumber() functions will all return a number
         * strictly less than 0x110000 or a negative value if an error
         * occurred.  The negative value is intercepted above, so
         * XmlEncode() is never passed a value it might return an
         * error for.
         */
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        char checkEntityDecl;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
                return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&parser->m_temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&parser->m_temp2Pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal.
        */
        if (pool == &dtd->pool)  /* are we called from prolog? */
          checkEntityDecl =
#ifdef XML_DTD
              parser->m_prologState.documentEntity &&
#endif /* XML_DTD */
              (dtd->standalone
               ? !parser->m_openInternalEntities
               : !dtd->hasParamEntityRefs);
        else /* if (pool == &parser->m_tempPool): we are called from content */
          checkEntityDecl = !dtd->hasParamEntityRefs || dtd->standalone;
        if (checkEntityDecl) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          /* Cannot report skipped entity here - see comments on
             parser->m_skippedEntityHandler.
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          */
          /* Cannot call the default handler because this would be
             out of sync with the call to the startElementHandler.
          if ((pool == &parser->m_tempPool) && parser->m_defaultHandler)
            reportDefault(parser, enc, ptr, next);
          */
          break;
        }
        if (entity->open) {
          if (enc == parser->m_encoding) {
            /* It does not appear that this line can be executed.
             *
             * The "if (entity->open)" check catches recursive entity
             * definitions.  In order to be called with an open
             * entity, it must have gone through this code before and
             * been through the recursive call to
             * appendAttributeValue() some lines below.  That call
             * sets the local encoding ("enc") to the parser's
             * internal encoding (internal_utf8 or internal_utf16),
             * which can never be the same as the principle encoding.
             * It doesn't appear there is another code path that gets
             * here with entity->open being TRUE.
             *
             * Since it is not certain that this logic is watertight,
             * we keep the line and merely exclude it from coverage
             * tests.
             */
            parser->m_eventPtr = ptr; /* LCOV_EXCL_LINE */
          }
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->notation) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (!entity->textPtr) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = XML_TRUE;
          result = appendAttributeValue(parser, parser->m_internalEncoding, isCdata,
                                        (char *)entity->textPtr,
                                        (char *)textEnd, pool);
          entity->open = XML_FALSE;
          if (result)
            return result;
        }
      }
      break;
    default:
      /* The only token returned by XmlAttributeValueTok() that does
       * not have an explicit case here is XML_TOK_PARTIAL_CHAR.
       * Getting that would require an entity name to contain an
       * incomplete XML character (e.g. \xE2\x82); however previous
       * tokenisers will have already recognised and rejected such
       * names before XmlAttributeValueTok() gets a look-in.  This
       * default case should be retained as a safety net, but the code
       * excluded from coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
      /* LCOV_EXCL_STOP */
    }
    ptr = next;
  }
  /* not reached */
}